

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

target_ulong_conflict
helper_lscbx_ppc(CPUPPCState_conflict *env,target_ulong_conflict addr,uint32_t reg,uint32_t ra,
                uint32_t rb)

{
  uint32_t uVar1;
  int iVar2;
  target_ulong_conflict tVar3;
  uintptr_t unaff_retaddr;
  
  if ((env->xer & 0x7f) == 0) {
    tVar3 = 0;
  }
  else {
    tVar3 = 0;
    iVar2 = 0x18;
    do {
      uVar1 = cpu_ldub_data_ra_ppc(env,addr + tVar3,unaff_retaddr);
      if ((reg != rb) && (ra == 0 || reg != ra)) {
        env->gpr[reg] =
             uVar1 << ((byte)iVar2 & 0x1f) | ~(0xff << ((byte)iVar2 & 0x1f)) & env->gpr[reg];
      }
      if (uVar1 == (env->xer >> 8 & 0xff)) {
        return tVar3;
      }
      if (iVar2 == 0) {
        reg = reg + 1 & 0x1f;
        iVar2 = 0x18;
      }
      else {
        iVar2 = iVar2 + -8;
      }
      tVar3 = tVar3 + 1;
    } while (tVar3 < (env->xer & 0x7f));
  }
  return tVar3;
}

Assistant:

target_ulong helper_lscbx(CPUPPCState *env, target_ulong addr, uint32_t reg,
                          uint32_t ra, uint32_t rb)
{
    int i, c, d;

    d = 24;
    for (i = 0; i < xer_bc; i++) {
        c = cpu_ldub_data_ra(env, addr, GETPC());
        addr = addr_add(env, addr, 1);
        /* ra (if not 0) and rb are never modified */
        if (likely(reg != rb && (ra == 0 || reg != ra))) {
            env->gpr[reg] = (env->gpr[reg] & ~(0xFF << d)) | (c << d);
        }
        if (unlikely(c == xer_cmp)) {
            break;
        }
        if (likely(d != 0)) {
            d -= 8;
        } else {
            d = 24;
            reg++;
            reg = reg & 0x1F;
        }
    }
    return i;
}